

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O3

uint64_t capnp::compiler::generateMethodParamsId
                   (uint64_t parentId,uint16_t methodOrdinal,bool isResults)

{
  long lVar1;
  ulong uVar2;
  uchar *puVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  uchar local_b0 [8];
  uint16_t local_a8;
  undefined1 local_a6;
  TypeIdGenerator local_a4;
  
  puVar3 = local_b0;
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  lVar1 = 0;
  do {
    *puVar3 = (uchar)(parentId >> ((byte)lVar1 & 0x3f));
    puVar3 = puVar3 + 1;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  local_a4.finished = false;
  local_a4.ctx.c = 0x98badcfe;
  local_a4.ctx.d = 0x10325476;
  local_a4.ctx.lo = 0;
  local_a4.ctx.hi = 0;
  local_a4.ctx.a = 0x67452301;
  local_a4.ctx.b = 0xefcdab89;
  AVar4.size_ = 0xb;
  AVar4.ptr = local_b0;
  local_a6 = isResults;
  local_a8 = methodOrdinal;
  TypeIdGenerator::update(&local_a4,AVar4);
  AVar4 = TypeIdGenerator::finish(&local_a4);
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar2 = (ulong)AVar4.ptr[lVar1] | uVar2 << 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return uVar2 | 0x8000000000000000;
}

Assistant:

uint64_t generateMethodParamsId(uint64_t parentId, uint16_t methodOrdinal, bool isResults) {
  // Compute ID by hashing the concatenation of the parent ID, the method ordinal, and a
  // boolean indicating whether this is the params or the results, and then taking the first 8
  // bytes.

  kj::byte bytes[sizeof(uint64_t) + sizeof(uint16_t) + 1]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    bytes[i] = (parentId >> (i * 8)) & 0xff;
  }
  for (uint i = 0; i < sizeof(uint16_t); i++) {
    bytes[sizeof(uint64_t) + i] = (methodOrdinal >> (i * 8)) & 0xff;
  }
  bytes[sizeof(bytes) - 1] = isResults;

  TypeIdGenerator generator;
  generator.update(bytes);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}